

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

void Imf_3_3::fillChannelWithZeroes(char **writePtr,Format format,PixelType type,size_t xSize)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  undefined8 uVar3;
  ArgExc *this;
  ulong in_RCX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  size_t i_1;
  size_t j_5;
  size_t j_4;
  size_t i;
  size_t j_3;
  size_t j_2;
  size_t j_1;
  size_t j;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  ArgExc *in_stack_ffffffffffffff60;
  ulong local_78;
  ulong local_70;
  undefined2 local_62;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_38;
  ulong local_28;
  ulong local_20;
  
  if (in_ESI == 1) {
    if (in_EDX == 0) {
      for (local_20 = 0; local_20 < in_RCX; local_20 = local_20 + 1) {
        Xdr::write<Imf_3_3::CharPtrIO,char*>
                  ((char **)in_stack_ffffffffffffff60,(uint)in_stack_ffffffffffffff5c);
      }
    }
    else if (in_EDX == 1) {
      for (local_28 = 0; local_28 < in_RCX; local_28 = local_28 + 1) {
        Imath_3_1::half::half((half *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        Xdr::write<Imf_3_3::CharPtrIO,char*>
                  ((char **)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (half)(uint16_t)((ulong)in_stack_ffffffffffffff60 >> 0x30));
      }
    }
    else {
      if (in_EDX != 2) {
        uVar3 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  (in_stack_ffffffffffffff60,
                   (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        __cxa_throw(uVar3,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        Xdr::write<Imf_3_3::CharPtrIO,char*>
                  ((char **)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      }
    }
  }
  else if (in_EDX == 0) {
    for (local_50 = 0; local_50 < in_RCX; local_50 = local_50 + 1) {
      for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
        uVar1 = *(undefined1 *)((long)&fillChannelWithZeroes::ui + local_58);
        puVar2 = (undefined1 *)*in_RDI;
        *in_RDI = (long)(puVar2 + 1);
        *puVar2 = uVar1;
      }
    }
  }
  else if (in_EDX == 1) {
    for (local_60 = 0; local_60 < in_RCX; local_60 = local_60 + 1) {
      Imath_3_1::half::half((half *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      *(undefined2 *)*in_RDI = local_62;
      *in_RDI = *in_RDI + 2;
    }
  }
  else {
    if (in_EDX != 2) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc
                (this,(char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      __cxa_throw(this,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    for (local_70 = 0; local_70 < in_RCX; local_70 = local_70 + 1) {
      for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
        uVar1 = *(undefined1 *)((long)&fillChannelWithZeroes::f + local_78);
        puVar2 = (undefined1 *)*in_RDI;
        *in_RDI = (long)(puVar2 + 1);
        *puVar2 = uVar1;
      }
    }
  }
  return;
}

Assistant:

void
fillChannelWithZeroes (
    char*& writePtr, Compressor::Format format, PixelType type, size_t xSize)
{
    if (format == Compressor::XDR)
    {
        //
        // Fill with data in XDR format.
        //

        switch (type)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                for (size_t j = 0; j < xSize; ++j)
                    Xdr::write<CharPtrIO> (writePtr, (unsigned int) 0);

                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                for (size_t j = 0; j < xSize; ++j)
                    Xdr::write<CharPtrIO> (writePtr, (half) 0);

                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                for (size_t j = 0; j < xSize; ++j)
                    Xdr::write<CharPtrIO> (writePtr, (float) 0);

                break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // Fill with data in NATIVE format.
        //

        switch (type)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                for (size_t j = 0; j < xSize; ++j)
                {
                    static const unsigned int ui = 0;

                    for (size_t i = 0; i < sizeof (ui); ++i)
                        *writePtr++ = ((char*) &ui)[i];
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                for (size_t j = 0; j < xSize; ++j)
                {
                    *(half*) writePtr = half (0);
                    writePtr += sizeof (half);
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                for (size_t j = 0; j < xSize; ++j)
                {
                    static const float f = 0;

                    for (size_t i = 0; i < sizeof (f); ++i)
                        *writePtr++ = ((char*) &f)[i];
                }
                break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
}